

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
kratos::Generator::get_block_name_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Generator *this,Stmt *stmt)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->named_blocks_)._M_h._M_before_begin;
  do {
    p_Var1 = p_Var1->_M_nxt;
    if (p_Var1 == (__node_base *)0x0) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      return __return_storage_ptr__;
    }
  } while ((Stmt *)p_Var1[5]._M_nxt != stmt);
  std::_Optional_payload_base<std::__cxx11::string>::
  _Optional_payload_base<std::__cxx11::string_const&>
            ((_Optional_payload_base<std::__cxx11::string> *)__return_storage_ptr__,p_Var1 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Generator::get_block_name(const Stmt *stmt) const {
    for (auto const &[name_, s] : named_blocks_) {
        if (s.get() == stmt) {
            return name_;
        }
    }
    return std::nullopt;
}